

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O3

int populate_gost_engine(ENGINE *e)

{
  GOST_NID_JOB *pGVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ASN1_OBJECT *obj;
  bool bVar5;
  int iVar6;
  long lVar7;
  char **ppcVar8;
  
  if (e != (ENGINE *)0x0) {
    iVar3 = ENGINE_set_id((ENGINE *)e,"gost");
    if (iVar3 == 0) {
      populate_gost_engine_cold_9();
    }
    else {
      iVar3 = ENGINE_set_name((ENGINE *)e,"Reference implementation of GOST engine");
      if (iVar3 == 0) {
        populate_gost_engine_cold_8();
      }
      else {
        iVar3 = OBJ_new_nid(2);
        lVar7 = 0;
        bVar2 = true;
        do {
          bVar5 = bVar2;
          pGVar1 = missing_NIDs[lVar7];
          iVar6 = (int)lVar7 + iVar3;
          obj = ASN1_OBJECT_create(iVar6,(uchar *)0x0,0,pGVar1->sn,pGVar1->ln);
          pGVar1->asn1 = (ASN1_OBJECT *)obj;
          if ((obj == (ASN1_OBJECT *)0x0) || (iVar4 = OBJ_add_object(obj), iVar4 == 0)) {
            populate_gost_engine_cold_7();
            return 0;
          }
          (*pGVar1->callback)(iVar6);
          lVar7 = 1;
          bVar2 = false;
        } while (bVar5);
        iVar3 = ENGINE_set_digests((ENGINE *)e,gost_digests);
        if (iVar3 == 0) {
          populate_gost_engine_cold_6();
        }
        else {
          iVar3 = ENGINE_set_ciphers((ENGINE *)e,gost_ciphers);
          if (iVar3 == 0) {
            populate_gost_engine_cold_5();
          }
          else {
            iVar3 = ENGINE_set_pkey_meths((ENGINE *)e,gost_pkey_meths);
            if (iVar3 == 0) {
              populate_gost_engine_cold_4();
            }
            else {
              iVar3 = ENGINE_set_pkey_asn1_meths((ENGINE *)e,gost_pkey_asn1_meths);
              if (iVar3 == 0) {
                populate_gost_engine_cold_3();
              }
              else {
                iVar3 = ENGINE_set_cmd_defns((ENGINE *)e,(ENGINE_CMD_DEFN *)gost_cmds);
                if (iVar3 == 0) {
                  populate_gost_engine_cold_2();
                }
                else {
                  iVar3 = ENGINE_set_ctrl_function((ENGINE *)e,gost_control_func);
                  if (iVar3 == 0) {
                    populate_gost_engine_cold_1();
                  }
                  else {
                    iVar3 = ENGINE_set_destroy_function((ENGINE *)e,gost_engine_destroy);
                    if (((iVar3 != 0) &&
                        (iVar3 = ENGINE_set_init_function((ENGINE *)e,gost_engine_init), iVar3 != 0)
                        ) && (iVar3 = ENGINE_set_finish_function((ENGINE *)e,gost_engine_finish),
                             iVar3 != 0)) {
                      ppcVar8 = &gost_meth_array[0].info;
                      do {
                        iVar3 = ((gost_meth_minfo *)(ppcVar8 + -4))->nid;
                        if (iVar3 != 0x497) {
                          if (iVar3 == 0) {
                            return 1;
                          }
                          iVar6 = register_ameth_gost(iVar3,(EVP_PKEY_ASN1_METHOD **)ppcVar8[-2],
                                                      ppcVar8[-1],*ppcVar8);
                          if (iVar6 == 0) {
                            return 0;
                          }
                          iVar3 = register_pmeth_gost(iVar3,(EVP_PKEY_METHOD **)ppcVar8[-3],0);
                          if (iVar3 == 0) {
                            return 0;
                          }
                        }
                        ppcVar8 = ppcVar8 + 5;
                      } while( true );
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int populate_gost_engine(ENGINE* e) {
    int ret = 0;

    if (e == NULL)
        goto end;
    if (!ENGINE_set_id(e, engine_gost_id)) {
        fprintf(stderr, "ENGINE_set_id failed\n");
        goto end;
    }
    if (!ENGINE_set_name(e, engine_gost_name)) {
        fprintf(stderr, "ENGINE_set_name failed\n");
        goto end;
    }
    if (!create_NIDs()) {
        fprintf(stderr, "NID creation failed\n");
        goto end;
    }
    if (!ENGINE_set_digests(e, gost_digests)) {
        fprintf(stderr, "ENGINE_set_digests failed\n");
        goto end;
    }
    if (!ENGINE_set_ciphers(e, gost_ciphers)) {
        fprintf(stderr, "ENGINE_set_ciphers failed\n");
        goto end;
    }
    if (!ENGINE_set_pkey_meths(e, gost_pkey_meths)) {
        fprintf(stderr, "ENGINE_set_pkey_meths failed\n");
        goto end;
    }
    if (!ENGINE_set_pkey_asn1_meths(e, gost_pkey_asn1_meths)) {
        fprintf(stderr, "ENGINE_set_pkey_asn1_meths failed\n");
        goto end;
    }
    /* Control function and commands */
    if (!ENGINE_set_cmd_defns(e, gost_cmds)) {
        fprintf(stderr, "ENGINE_set_cmd_defns failed\n");
        goto end;
    }
    if (!ENGINE_set_ctrl_function(e, gost_control_func)) {
        fprintf(stderr, "ENGINE_set_ctrl_func failed\n");
        goto end;
    }
    if (!ENGINE_set_destroy_function(e, gost_engine_destroy)
        || !ENGINE_set_init_function(e, gost_engine_init)
        || !ENGINE_set_finish_function(e, gost_engine_finish)) {
        goto end;
    }

    /*
     * "register" in "register_ameth_gost" and "register_pmeth_gost" is
     * not registering in an ENGINE sense, where things are hooked into
     * OpenSSL's library.  "register_ameth_gost" and "register_pmeth_gost"
     * merely allocate and populate the method structures of this engine.
     */
    struct gost_meth_minfo *minfo = gost_meth_array;
    for (; minfo->nid; minfo++) {

        /* This skip looks temporary. */
        if (minfo->nid == NID_id_tc26_cipher_gostr3412_2015_magma_ctracpkm_omac)
            continue;

        if (!register_ameth_gost(minfo->nid, minfo->ameth, minfo->pemstr,
                minfo->info))
            goto end;
        if (!register_pmeth_gost(minfo->nid, minfo->pmeth, 0))
            goto end;
    }

    ret = 1;
  end:
    return ret;
}